

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimal.cpp
# Opt level: O2

void castRay(RTCScene scene,float ox,float oy,float oz,float dx,float dy,float dz)

{
  RTCRayHit rayhit;
  float local_68;
  float local_64;
  float local_60;
  undefined4 local_5c;
  float local_58;
  float local_54;
  float local_50;
  undefined8 local_48;
  undefined4 local_3c;
  uint local_24;
  ulong local_20;
  
  local_5c = 0;
  local_48 = 0xffffffff7f800000;
  local_3c = 0;
  local_20 = 0xffffffffffffffff;
  local_68 = ox;
  local_64 = oy;
  local_60 = oz;
  local_58 = dx;
  local_54 = dy;
  local_50 = dz;
  rtcIntersect1(scene,&local_68,0);
  printf("%f, %f, %f: ",(double)ox,(double)oy,(double)oz);
  if ((int)local_20 == -1) {
    puts("Did not find any intersection.");
  }
  else {
    printf("Found intersection on geometry %d, primitive %d at tfar=%f\n",(double)(float)local_48,
           local_20 & 0xffffffff,(ulong)local_24);
  }
  return;
}

Assistant:

void castRay(RTCScene scene,
             float ox, float oy, float oz,
             float dx, float dy, float dz)
{
  /*
   * The ray hit structure holds both the ray and the hit.
   * The user must initialize it properly -- see API documentation
   * for rtcIntersect1() for details.
   */
  struct RTCRayHit rayhit;
  rayhit.ray.org_x = ox;
  rayhit.ray.org_y = oy;
  rayhit.ray.org_z = oz;
  rayhit.ray.dir_x = dx;
  rayhit.ray.dir_y = dy;
  rayhit.ray.dir_z = dz;
  rayhit.ray.tnear = 0;
  rayhit.ray.tfar = std::numeric_limits<float>::infinity();
  rayhit.ray.mask = -1;
  rayhit.ray.flags = 0;
  rayhit.hit.geomID = RTC_INVALID_GEOMETRY_ID;
  rayhit.hit.instID[0] = RTC_INVALID_GEOMETRY_ID;

  /*
   * There are multiple variants of rtcIntersect. This one
   * intersects a single ray with the scene.
   */
  rtcIntersect1(scene, &rayhit);

  printf("%f, %f, %f: ", ox, oy, oz);
  if (rayhit.hit.geomID != RTC_INVALID_GEOMETRY_ID)
  {
    /* Note how geomID and primID identify the geometry we just hit.
     * We could use them here to interpolate geometry information,
     * compute shading, etc.
     * Since there is only a single triangle in this scene, we will
     * get geomID=0 / primID=0 for all hits.
     * There is also instID, used for instancing. See
     * the instancing tutorials for more information */
    printf("Found intersection on geometry %d, primitive %d at tfar=%f\n", 
           rayhit.hit.geomID,
           rayhit.hit.primID,
           rayhit.ray.tfar);
  }
  else
    printf("Did not find any intersection.\n");
}